

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::Formattable::getString(Formattable *this,UnicodeString *result,UErrorCode *status)

{
  UErrorCode *status_local;
  UnicodeString *result_local;
  Formattable *this_local;
  
  if (this->fType == kString) {
    if ((this->fValue).fObject == (UObject *)0x0) {
      setError(status,U_MEMORY_ALLOCATION_ERROR);
    }
    else {
      UnicodeString::operator=(result,(this->fValue).fString);
    }
  }
  else {
    setError(status,U_INVALID_FORMAT_ERROR);
    UnicodeString::setToBogus(result);
  }
  return result;
}

Assistant:

UnicodeString& 
Formattable::getString(UnicodeString& result, UErrorCode& status) const 
{
    if (fType != kString) {
        setError(status, U_INVALID_FORMAT_ERROR);
        result.setToBogus();
    } else {
        if (fValue.fString == NULL) {
            setError(status, U_MEMORY_ALLOCATION_ERROR);
        } else {
            result = *fValue.fString;
        }
    }
    return result;
}